

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall
Clasp::DefaultMinimize::handleUnsat(DefaultMinimize *this,Solver *s,bool up,LitVec *out)

{
  uint uVar1;
  uint uVar2;
  SharedData *pSVar3;
  bool bVar4;
  
  pSVar3 = (this->super_MinimizeConstraint).shared_;
  if (pSVar3->optGen_ == 0) {
    if (pSVar3->mode_ == enumerate) goto LAB_00150f38;
  }
  else if ((pSVar3->mode_ == enumerate) ||
          ((pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar3->optGen_)) {
LAB_00150f38:
    bVar4 = false;
    goto LAB_00150f3a;
  }
  bVar4 = commitLowerBound(this,s,up);
LAB_00150f3a:
  uVar1 = (this->super_MinimizeConstraint).tag_.rep_;
  uVar2 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
  if ((byte)((byte)uVar2 & 3) == (byte)(2U - ((uVar1 & 2) == 0))) {
    relaxBound(this,false);
    if ((bVar4 == true && 0xf < uVar2) && (uVar1 = (s->levels_).root, uVar2 >> 4 <= uVar1)) {
      Solver::popRootLevel(s,uVar1 - (uVar2 >> 4),out,true);
      bVar4 = Solver::popRootLevel(s,1,(LitVec *)0x0,true);
      return bVar4;
    }
  }
  else {
    relaxBound(this,false);
  }
  return false;
}

Assistant:

bool DefaultMinimize::handleUnsat(Solver& s, bool up, LitVec& out) {
	bool more = shared_->optimize() && commitLowerBound(s, up);
	uint32 dl = s.isTrue(tag_) ? s.level(tag_.var()) : 0;
	relaxBound(false);
	if (more && dl && dl <= s.rootLevel()) {
		s.popRootLevel(s.rootLevel()-dl, &out); // pop and remember new path
		return s.popRootLevel(1);               // pop tag - disable constraint
	}
	return false;
}